

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O0

void delete_prefix<loc_rib_data>(node<loc_rib_data> *prefix,bool is_delete_child_prefix)

{
  node<loc_rib_data> *pnVar1;
  bool bVar2;
  node<loc_rib_data> *local_30;
  node<loc_rib_data> *current;
  node<loc_rib_data> *tmp2;
  node<loc_rib_data> *tmp1;
  bool is_delete_child_prefix_local;
  node<loc_rib_data> *prefix_local;
  
  prefix->is_prefix = false;
  if (prefix->data == (loc_rib_data *)0x0) {
    free(prefix->data);
    prefix->data = (loc_rib_data *)0x0;
  }
  if ((is_delete_child_prefix) ||
     ((prefix->node_1 == (node<loc_rib_data> *)0x0 && (prefix->node_0 == (node<loc_rib_data> *)0x0))
     )) {
    if ((is_delete_child_prefix) &&
       ((prefix->node_1 != (node<loc_rib_data> *)0x0 &&
        (prefix->node_0 == (node<loc_rib_data> *)0x0)))) {
      delete_prefix<loc_rib_data>(prefix->node_1,true);
    }
    else if ((is_delete_child_prefix) &&
            ((prefix->node_0 != (node<loc_rib_data> *)0x0 &&
             (prefix->node_1 == (node<loc_rib_data> *)0x0)))) {
      delete_prefix<loc_rib_data>(prefix->node_0,true);
    }
    else {
      local_30 = prefix;
      if ((is_delete_child_prefix) &&
         ((prefix->node_1 != (node<loc_rib_data> *)0x0 &&
          (prefix->node_0 != (node<loc_rib_data> *)0x0)))) {
        pnVar1 = prefix->node_0;
        pnVar1->parent = (node<loc_rib_data> *)0x0;
        prefix->node_0 = (node<loc_rib_data> *)0x0;
        delete_prefix<loc_rib_data>(prefix,true);
        delete_prefix<loc_rib_data>(pnVar1,true);
      }
      else {
        while( true ) {
          bVar2 = false;
          if (((local_30->is_prefix & 1U) == 0) &&
             ((bVar2 = false, local_30->parent != (node<loc_rib_data> *)0x0 &&
              (bVar2 = true, local_30->parent->node_0 != (node<loc_rib_data> *)0x0)))) {
            bVar2 = local_30->parent->node_1 == (node<loc_rib_data> *)0x0;
          }
          if (!bVar2) break;
          pnVar1 = local_30->parent;
          if (local_30->parent->node_1 == local_30) {
            local_30->parent->node_1 = (node<loc_rib_data> *)0x0;
          }
          else {
            local_30->parent->node_0 = (node<loc_rib_data> *)0x0;
          }
          free(local_30);
          local_30 = pnVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void delete_prefix(node<DATA_TYPE>* prefix, bool is_delete_child_prefix = false){
    prefix->is_prefix = false; // 削除対象のプレフィックスはプレフィックス扱いしない
    if(prefix->data == nullptr){
        free(prefix->data);
        prefix->data = nullptr;
    }
    if(!is_delete_child_prefix and (prefix->node_1 != nullptr or prefix->node_0 != nullptr)){
        return;
    }
    if(is_delete_child_prefix and prefix->node_1 != nullptr and prefix->node_0 == nullptr){
        return delete_prefix(prefix->node_1, true);
    }
    if(is_delete_child_prefix and prefix->node_0 != nullptr and prefix->node_1 == nullptr){
        return delete_prefix(prefix->node_0, true);
    }
    node<DATA_TYPE>* tmp1;
    if(is_delete_child_prefix and prefix->node_1 != nullptr and prefix->node_0 != nullptr){
        tmp1 = prefix->node_0;
        tmp1->parent = nullptr;
        prefix->node_0 = nullptr;
        delete_prefix(prefix, true);
        return delete_prefix(tmp1, true);
    }
    node<DATA_TYPE>* tmp2;
    node<DATA_TYPE>* current = prefix;
    while(!current->is_prefix and current->parent != nullptr and (current->parent->node_0 == nullptr or current->parent->node_1 == nullptr)){
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Release: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(current->prefix)}), current->prefix_len, current);
#endif
        tmp2 = current->parent;
        if(current->parent->node_1 == current){
            current->parent->node_1 = nullptr;
        }else{
            current->parent->node_0 = nullptr;
        }
        free(current);
        current = tmp2;
    }
}